

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QWizardPage::cleanupPage(QWizardPage *this)

{
  char *name;
  QVariant *value;
  long lVar1;
  
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (lVar1 != 0) {
    lVar1 = *(long *)(lVar1 + 8);
    value = (QVariant *)(*(long *)(lVar1 + 0x2f0) + 0x60);
    for (lVar1 = *(long *)(lVar1 + 0x2f8) << 7; lVar1 != 0; lVar1 = lVar1 + -0x80) {
      if (value[-3].d.data.shared == (PrivateShared *)this) {
        name = *(char **)&value[-2].d.field_0x18;
        if (name == (char *)0x0) {
          name = (char *)&QByteArray::_empty;
        }
        QObject::setProperty(*(QObject **)((long)&value[-2].d.data + 8),name,value);
      }
      value = value + 4;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }